

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode128Reader.cpp
# Opt level: O0

bool __thiscall ZXing::OneD::Raw2TxtDecoder::decode(Raw2TxtDecoder *this,int code)

{
  byte bVar1;
  undefined8 uVar2;
  int iVar3;
  int in_ESI;
  int *in_RDI;
  int offset;
  bool unshift;
  int in_stack_00000048;
  int in_stack_0000004c;
  undefined1 in_stack_ffffffffffffff8f;
  Raw2TxtDecoder *in_stack_ffffffffffffff90;
  string local_38 [36];
  int local_14;
  
  local_14 = in_ESI;
  uVar2 = std::__cxx11::string::size();
  *(undefined8 *)(in_RDI + 0xc) = uVar2;
  if (*in_RDI == 99) {
    if (local_14 < 100) {
      ToString<int,void>(in_stack_0000004c,in_stack_00000048);
      std::__cxx11::string::append((string *)(in_RDI + 4));
      std::__cxx11::string::~string(local_38);
    }
    else if (local_14 == 0x66) {
      fnc1(in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f);
    }
    else {
      *in_RDI = local_14;
    }
  }
  else {
    bVar1 = *(byte *)((long)in_RDI + 0x3a);
    switch((Raw2TxtDecoder *)(ulong)(local_14 - 0x60)) {
    case (Raw2TxtDecoder *)0x0:
      *(undefined1 *)(in_RDI + 2) = 1;
      break;
    case (Raw2TxtDecoder *)0x1:
      break;
    case (Raw2TxtDecoder *)0x2:
      if ((*(byte *)((long)in_RDI + 0x3a) & 1) != 0) {
        return false;
      }
      *(undefined1 *)((long)in_RDI + 0x3a) = 1;
      iVar3 = 0x65;
      if (*in_RDI == 0x65) {
        iVar3 = 100;
      }
      *in_RDI = iVar3;
      break;
    case (Raw2TxtDecoder *)0x3:
      *in_RDI = 99;
      break;
    case (Raw2TxtDecoder *)0x4:
    case (Raw2TxtDecoder *)0x5:
      if (*in_RDI == local_14) {
        if ((*(byte *)((long)in_RDI + 0x39) & 1) != 0) {
          *(byte *)(in_RDI + 0xe) = (*(byte *)(in_RDI + 0xe) ^ 0xff) & 1;
        }
        *(byte *)((long)in_RDI + 0x39) = (*(byte *)((long)in_RDI + 0x39) ^ 0xff) & 1;
      }
      else {
        *in_RDI = local_14;
      }
      break;
    case (Raw2TxtDecoder *)0x6:
      fnc1((Raw2TxtDecoder *)(ulong)(local_14 - 0x60),(bool)in_stack_ffffffffffffff8f);
      break;
    default:
      std::__cxx11::string::push_back((char)in_RDI + '\x10');
      *(undefined1 *)((long)in_RDI + 0x39) = 0;
    }
    if ((bVar1 & 1) != 0) {
      iVar3 = 0x65;
      if (*in_RDI == 0x65) {
        iVar3 = 100;
      }
      *in_RDI = iVar3;
      *(undefined1 *)((long)in_RDI + 0x3a) = 0;
    }
  }
  return true;
}

Assistant:

bool decode(int code)
	{
		lastTxtSize = txt.size();

		if (codeSet == CODE_CODE_C) {
			if (code < 100) {
				txt.append(ToString(code, 2));
			} else if (code == CODE_FNC_1) {
				fnc1(true /*isCodeSetC*/);
			} else {
				codeSet = code; // CODE_A / CODE_B
			}
		} else { // codeSet A or B
			bool unshift = shift;

			switch (code) {
			case CODE_FNC_1: fnc1(false /*isCodeSetC*/); break;
			case CODE_FNC_2:
				// Message Append - do nothing?
				break;
			case CODE_FNC_3:
				_readerInit = true; // Can occur anywhere in the symbol (ISO/IEC 15417:2007 4.3.4.2 (c))
				break;
			case CODE_SHIFT:
				if (shift)
					return false; // two shifts in a row make no sense
				shift = true;
				codeSet = codeSet == CODE_CODE_A ? CODE_CODE_B : CODE_CODE_A;
				break;
			case CODE_CODE_A:
			case CODE_CODE_B:
				if (codeSet == code) {
					// FNC4
					if (fnc4Next)
						fnc4All = !fnc4All;
					fnc4Next = !fnc4Next;
				} else {
					codeSet = code;
				}
				break;
			case CODE_CODE_C: codeSet = CODE_CODE_C; break;

			default: {
				// code < 96 at this point
				int offset;
				if (codeSet == CODE_CODE_A && code >= 64)
					offset = fnc4All == fnc4Next ? -64 : +64;
				else
					offset = fnc4All == fnc4Next ? ' ' : ' ' + 128;
				txt.push_back((char)(code + offset));
				fnc4Next = false;
				break;
			}
			}

			// Unshift back to another code set if we were shifted
			if (unshift) {
				codeSet = codeSet == CODE_CODE_A ? CODE_CODE_B : CODE_CODE_A;
				shift = false;
			}
		}

		return true;
	}